

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::transcode_uastc_to_etc2_eac_a8
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined6 uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  int iVar24;
  int iVar25;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar27;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar26;
  undefined1 auVar23 [16];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  uint uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar35;
  uint uVar36;
  uint uVar39;
  uint uVar40;
  undefined1 auVar37 [16];
  uint uVar41;
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  short sVar45;
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar53;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [16];
  uint uVar58;
  undefined1 auVar55 [16];
  uint uVar59;
  uint uVar62;
  uint uVar63;
  undefined1 auVar60 [16];
  uint uVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  long lVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  uint32_t vals [8];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  undefined1 auVar47 [16];
  undefined1 uVar51;
  undefined2 uVar52;
  
  uVar8 = unpacked_src_blk->m_mode;
  if ((ulong)uVar8 - 0x12 < 0xfffffffffffffff6 || (ulong)uVar8 == 8) {
    uVar4 = 0x1dff;
    if (uVar8 == 8) {
      uVar4 = (unpacked_src_blk->m_solid_color).field_0.field_0.a | 0x1d00;
    }
  }
  else {
    auVar13 = (undefined1  [16])0x0;
    lVar5 = 0;
    auVar18 = _DAT_001e36f0;
    do {
      auVar30._8_8_ =
           (ulong)(*block_pixels)[lVar5 + 2].field_0.field_0.a |
           (ulong)(*block_pixels)[lVar5 + 3].field_0.field_0.a << 0x20;
      auVar30._0_8_ =
           (ulong)(*block_pixels)[lVar5].field_0.field_0.a |
           (ulong)(*block_pixels)[lVar5 + 1].field_0.field_0.a << 0x20;
      auVar37 = auVar30 | _DAT_001e3030;
      auVar17 = auVar18 ^ _DAT_001e3030;
      auVar14 = auVar13 ^ _DAT_001e3030;
      auVar42._0_4_ = -(uint)(auVar37._0_4_ < auVar14._0_4_);
      auVar42._4_4_ = -(uint)(auVar37._4_4_ < auVar14._4_4_);
      auVar42._8_4_ = -(uint)(auVar37._8_4_ < auVar14._8_4_);
      auVar42._12_4_ = -(uint)(auVar37._12_4_ < auVar14._12_4_);
      auVar14._0_4_ = -(uint)(auVar17._0_4_ < auVar37._0_4_);
      auVar14._4_4_ = -(uint)(auVar17._4_4_ < auVar37._4_4_);
      auVar14._8_4_ = -(uint)(auVar17._8_4_ < auVar37._8_4_);
      auVar14._12_4_ = -(uint)(auVar17._12_4_ < auVar37._12_4_);
      auVar18 = ~auVar14 & auVar30 | auVar18 & auVar14;
      auVar13 = ~auVar42 & auVar30 | auVar13 & auVar42;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    auVar17._0_8_ = auVar18._8_8_;
    auVar17._8_4_ = auVar18._8_4_;
    auVar17._12_4_ = auVar18._12_4_;
    auVar14 = auVar18 ^ _DAT_001e3030;
    auVar42 = auVar17 ^ _DAT_001e3030;
    auVar43._0_4_ = -(uint)(auVar14._0_4_ < auVar42._0_4_);
    auVar43._4_4_ = -(uint)(auVar14._4_4_ < auVar42._4_4_);
    auVar43._8_4_ = -(uint)(auVar14._8_4_ < auVar42._8_4_);
    auVar43._12_4_ = -(uint)(auVar14._12_4_ < auVar42._12_4_);
    auVar18 = ~auVar43 & auVar17 | auVar18 & auVar43;
    uVar34 = auVar18._4_4_;
    uVar8 = auVar18._0_4_;
    uVar16 = (uint)DAT_001e3030;
    uVar35 = -(uint)((int)(uVar8 ^ uVar16) < (int)(uVar34 ^ uVar16));
    uVar35 = ~uVar35 & uVar34 | uVar8 & uVar35;
    auVar18._0_8_ = auVar13._8_8_;
    auVar18._8_4_ = auVar13._8_4_;
    auVar18._12_4_ = auVar13._12_4_;
    auVar14 = auVar13 ^ _DAT_001e3030;
    auVar42 = auVar18 ^ _DAT_001e3030;
    auVar37._0_4_ = -(uint)(auVar42._0_4_ < auVar14._0_4_);
    auVar37._4_4_ = -(uint)(auVar42._4_4_ < auVar14._4_4_);
    auVar37._8_4_ = -(uint)(auVar42._8_4_ < auVar14._8_4_);
    auVar37._12_4_ = -(uint)(auVar42._12_4_ < auVar14._12_4_);
    auVar18 = ~auVar37 & auVar18 | auVar13 & auVar37;
    uVar34 = auVar18._4_4_;
    uVar8 = auVar18._0_4_;
    uVar16 = -(uint)((int)(uVar34 ^ uVar16) < (int)(uVar8 ^ uVar16));
    uVar8 = ~uVar16 & uVar34 | uVar8 & uVar16;
    if (uVar35 != uVar8) {
      uVar16 = unpacked_src_blk->m_etc2_hints;
      if (0xf < uVar16) {
        lVar5 = (ulong)(uVar16 & 0xf) * 8;
        iVar11 = (int)*(char *)((long)&DAT_001e5bb1 + lVar5 + 2);
        fVar12 = roundf(((float)(int)uVar8 - (float)(int)uVar35) *
                        ((float)-iVar11 / (float)((char)(&DAT_001e5bb7)[lVar5] - iVar11)) +
                        (float)(int)uVar35);
        iVar11 = (int)fVar12;
        *(ushort *)pDst = (ushort)iVar11 & 0xff | (ushort)(uVar16 << 8);
        lVar6 = 0;
        do {
          uVar1 = *(undefined4 *)(&g_eac_modifier_table + lVar6 + lVar5);
          uVar51 = (undefined1)((uint)uVar1 >> 0x18);
          uVar52 = CONCAT11(uVar51,uVar51);
          uVar51 = (undefined1)((uint)uVar1 >> 0x10);
          uVar2 = CONCAT35(CONCAT21(uVar52,uVar51),CONCAT14(uVar51,uVar1));
          uVar51 = (undefined1)((uint)uVar1 >> 8);
          uVar3 = CONCAT51(CONCAT41((int)((ulong)uVar2 >> 0x20),uVar51),uVar51);
          sVar45 = CONCAT11((char)uVar1,(char)uVar1);
          uVar7 = CONCAT62(uVar3,sVar45);
          auVar13._8_4_ = 0;
          auVar13._0_8_ = uVar7;
          auVar13._12_2_ = uVar52;
          auVar13._14_2_ = uVar52;
          uVar52 = (undefined2)((ulong)uVar2 >> 0x20);
          auVar47._12_4_ = auVar13._12_4_;
          auVar47._8_2_ = 0;
          auVar47._0_8_ = uVar7;
          auVar47._10_2_ = uVar52;
          auVar46._10_6_ = auVar47._10_6_;
          auVar46._8_2_ = uVar52;
          auVar46._0_8_ = uVar7;
          uVar52 = (undefined2)uVar3;
          auVar29._4_8_ = auVar46._8_8_;
          auVar29._2_2_ = uVar52;
          auVar29._0_2_ = uVar52;
          auVar48._4_4_ = auVar29._0_4_ >> 0x18;
          auVar48._12_4_ = auVar47._12_4_ >> 0x18;
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar54._0_4_ = (uVar16 >> 4) * ((int)sVar45 >> 8) + iVar11;
          auVar54._4_4_ = auVar48._4_4_ * (uVar16 >> 4) + iVar11;
          auVar54._8_4_ = (uVar16 >> 4) * (auVar46._8_4_ >> 0x18) + iVar11;
          auVar54._12_4_ = (int)((auVar48._8_8_ & 0xffffffff) * (ulong)(uVar16 >> 4)) + iVar11;
          auVar18 = auVar54 ^ _DAT_001e3030;
          auVar49._0_4_ = -(uint)(-0x7fffff01 < auVar18._0_4_);
          auVar49._4_4_ = -(uint)(-0x7fffff01 < auVar18._4_4_);
          auVar49._8_4_ = -(uint)(-0x7fffff01 < auVar18._8_4_);
          auVar49._12_4_ = -(uint)(-0x7fffff01 < auVar18._12_4_);
          auVar60._0_4_ = auVar54._0_4_ >> 0x1f;
          auVar60._4_4_ = auVar54._4_4_ >> 0x1f;
          auVar60._8_4_ = auVar54._8_4_ >> 0x1f;
          auVar60._12_4_ = auVar54._12_4_ >> 0x1f;
          *(undefined1 (*) [16])(&local_98 + lVar6) =
               (~auVar49 & auVar54 | ~auVar60 & auVar49) & _DAT_001e36f0;
          lVar6 = lVar6 + 4;
        } while (lVar6 != 8);
        lVar6 = 0;
        lVar66 = 1;
        lVar5 = 0;
        uVar67 = 0;
        uVar7 = 0;
        do {
          uVar9 = (ulong)(((uint)lVar5 & 2) << 4);
          uVar10 = (ulong)((uint)lVar5 & 0xfffffffc);
          auVar19._8_8_ = 0;
          auVar19._0_8_ =
               (ulong)(*block_pixels)[0].field_0.c[uVar10 + uVar9 + 3] |
               (ulong)block_pixels[1][0].field_0.c[uVar10 + uVar9 + 3] << 0x20;
          auVar19 = auVar19 & _DAT_001e3980;
          iVar11 = auVar19._0_4_;
          iVar24 = auVar19._4_4_;
          iVar25 = auVar19._8_4_;
          iVar27 = auVar19._12_4_;
          uVar8 = local_98 - iVar11 >> 0x1f;
          uVar16 = local_98 - iVar24 >> 0x1f;
          uVar35 = iStack_94 - iVar25 >> 0x1f;
          uVar34 = iStack_94 - iVar27 >> 0x1f;
          uVar36 = iStack_94 - iVar11 >> 0x1f;
          uVar39 = iStack_94 - iVar24 >> 0x1f;
          uVar40 = iStack_90 - iVar25 >> 0x1f;
          uVar41 = iStack_90 - iVar27 >> 0x1f;
          auVar15._0_4_ = ((local_98 - iVar11 ^ uVar8) - uVar8) * 8;
          auVar15._4_4_ = ((local_98 - iVar24 ^ uVar16) - uVar16) * 8;
          auVar15._8_4_ = ((iStack_94 - iVar25 ^ uVar35) - uVar35) * 8;
          auVar15._12_4_ = ((iStack_94 - iVar27 ^ uVar34) - uVar34) * 8;
          auVar68._0_4_ = ((iStack_94 - iVar11 ^ uVar36) - uVar36) * 8;
          auVar68._4_4_ = ((iStack_94 - iVar24 ^ uVar39) - uVar39) * 8;
          auVar68._8_4_ = ((iStack_90 - iVar25 ^ uVar40) - uVar40) * 8;
          auVar68._12_4_ = ((iStack_90 - iVar27 ^ uVar41) - uVar41) * 8;
          uVar8 = iStack_90 - iVar11 >> 0x1f;
          uVar16 = iStack_90 - iVar24 >> 0x1f;
          uVar35 = iStack_8c - iVar25 >> 0x1f;
          uVar34 = iStack_8c - iVar27 >> 0x1f;
          uVar53 = iStack_8c - iVar11 >> 0x1f;
          uVar56 = iStack_8c - iVar24 >> 0x1f;
          uVar57 = local_88 - iVar25 >> 0x1f;
          uVar58 = local_88 - iVar27 >> 0x1f;
          uVar59 = local_88 - iVar11 >> 0x1f;
          uVar62 = local_88 - iVar24 >> 0x1f;
          uVar63 = iStack_84 - iVar25 >> 0x1f;
          uVar64 = iStack_84 - iVar27 >> 0x1f;
          auVar18 = auVar15 ^ _DAT_001e3030;
          auVar13 = (auVar68 | _DAT_001e3990) ^ _DAT_001e3030;
          auVar65._0_4_ = -(uint)(auVar18._0_4_ < auVar13._0_4_);
          auVar65._4_4_ = -(uint)(auVar18._4_4_ < auVar13._4_4_);
          auVar65._8_4_ = -(uint)(auVar18._8_4_ < auVar13._8_4_);
          auVar65._12_4_ = -(uint)(auVar18._12_4_ < auVar13._12_4_);
          auVar31._0_4_ = ((iStack_90 - iVar11 ^ uVar8) - uVar8) * 8;
          auVar31._4_4_ = ((iStack_90 - iVar24 ^ uVar16) - uVar16) * 8;
          auVar31._8_4_ = ((iStack_8c - iVar25 ^ uVar35) - uVar35) * 8;
          auVar31._12_4_ = ((iStack_8c - iVar27 ^ uVar34) - uVar34) * 8;
          uVar36 = iStack_84 - iVar11 >> 0x1f;
          uVar39 = iStack_84 - iVar24 >> 0x1f;
          uVar40 = iStack_84 - iVar25 >> 0x1f;
          uVar41 = iStack_84 - iVar27 >> 0x1f;
          auVar14 = ~auVar65 & (auVar68 | _DAT_001e3990) | auVar15 & auVar65;
          auVar13 = (auVar31 | _DAT_001e39a0) ^ _DAT_001e3030;
          auVar18 = auVar14 ^ _DAT_001e3030;
          auVar20._0_4_ = -(uint)(auVar18._0_4_ < auVar13._0_4_);
          auVar20._4_4_ = -(uint)(auVar18._4_4_ < auVar13._4_4_);
          auVar20._8_4_ = -(uint)(auVar18._8_4_ < auVar13._8_4_);
          auVar20._12_4_ = -(uint)(auVar18._12_4_ < auVar13._12_4_);
          auVar38._0_4_ = ((iStack_8c - iVar11 ^ uVar53) - uVar53) * 8;
          auVar38._4_4_ = ((iStack_8c - iVar24 ^ uVar56) - uVar56) * 8;
          auVar38._8_4_ = ((local_88 - iVar25 ^ uVar57) - uVar57) * 8;
          auVar38._12_4_ = ((local_88 - iVar27 ^ uVar58) - uVar58) * 8;
          auVar13 = ~auVar20 & (auVar31 | _DAT_001e39a0) | auVar14 & auVar20;
          auVar18 = auVar13 ^ _DAT_001e3030;
          auVar14 = (auVar38 | _DAT_001e39b0) ^ _DAT_001e3030;
          auVar32._0_4_ = -(uint)(auVar18._0_4_ < auVar14._0_4_);
          auVar32._4_4_ = -(uint)(auVar18._4_4_ < auVar14._4_4_);
          auVar32._8_4_ = -(uint)(auVar18._8_4_ < auVar14._8_4_);
          auVar32._12_4_ = -(uint)(auVar18._12_4_ < auVar14._12_4_);
          auVar44._0_4_ = ((local_88 - iVar11 ^ uVar59) - uVar59) * 8;
          auVar44._4_4_ = ((local_88 - iVar24 ^ uVar62) - uVar62) * 8;
          auVar44._8_4_ = ((iStack_84 - iVar25 ^ uVar63) - uVar63) * 8;
          auVar44._12_4_ = ((iStack_84 - iVar27 ^ uVar64) - uVar64) * 8;
          uVar8 = iStack_80 - iVar11 >> 0x1f;
          uVar16 = iStack_80 - iVar24 >> 0x1f;
          uVar35 = iStack_80 - iVar25 >> 0x1f;
          uVar34 = iStack_80 - iVar27 >> 0x1f;
          auVar14 = ~auVar32 & (auVar38 | _DAT_001e39b0) | auVar13 & auVar32;
          auVar13 = (auVar44 | _DAT_001e39c0) ^ _DAT_001e3030;
          auVar18 = auVar14 ^ _DAT_001e3030;
          auVar21._0_4_ = -(uint)(auVar18._0_4_ < auVar13._0_4_);
          auVar21._4_4_ = -(uint)(auVar18._4_4_ < auVar13._4_4_);
          auVar21._8_4_ = -(uint)(auVar18._8_4_ < auVar13._8_4_);
          auVar21._12_4_ = -(uint)(auVar18._12_4_ < auVar13._12_4_);
          auVar50._0_4_ = ((iStack_84 - iVar11 ^ uVar36) - uVar36) * 8;
          auVar50._4_4_ = ((iStack_84 - iVar24 ^ uVar39) - uVar39) * 8;
          auVar50._8_4_ = ((iStack_84 - iVar25 ^ uVar40) - uVar40) * 8;
          auVar50._12_4_ = ((iStack_84 - iVar27 ^ uVar41) - uVar41) * 8;
          auVar13 = ~auVar21 & (auVar44 | _DAT_001e39c0) | auVar14 & auVar21;
          auVar18 = auVar13 ^ _DAT_001e3030;
          auVar14 = (auVar50 | _DAT_001e39d0) ^ _DAT_001e3030;
          auVar33._0_4_ = -(uint)(auVar18._0_4_ < auVar14._0_4_);
          auVar33._4_4_ = -(uint)(auVar18._4_4_ < auVar14._4_4_);
          auVar33._8_4_ = -(uint)(auVar18._8_4_ < auVar14._8_4_);
          auVar33._12_4_ = -(uint)(auVar18._12_4_ < auVar14._12_4_);
          auVar55._0_4_ = ((iStack_80 - iVar11 ^ uVar8) - uVar8) * 8;
          auVar55._4_4_ = ((iStack_80 - iVar24 ^ uVar16) - uVar16) * 8;
          auVar55._8_4_ = ((iStack_80 - iVar25 ^ uVar35) - uVar35) * 8;
          auVar55._12_4_ = ((iStack_80 - iVar27 ^ uVar34) - uVar34) * 8;
          uVar8 = iStack_7c - iVar11 >> 0x1f;
          uVar16 = iStack_7c - iVar24 >> 0x1f;
          uVar35 = iStack_7c - iVar25 >> 0x1f;
          uVar34 = iStack_7c - iVar27 >> 0x1f;
          auVar14 = ~auVar33 & (auVar50 | _DAT_001e39d0) | auVar13 & auVar33;
          auVar13 = (auVar55 | _DAT_001e39e0) ^ _DAT_001e3030;
          auVar18 = auVar14 ^ _DAT_001e3030;
          auVar22._0_4_ = -(uint)(auVar18._0_4_ < auVar13._0_4_);
          auVar22._4_4_ = -(uint)(auVar18._4_4_ < auVar13._4_4_);
          auVar22._8_4_ = -(uint)(auVar18._8_4_ < auVar13._8_4_);
          auVar22._12_4_ = -(uint)(auVar18._12_4_ < auVar13._12_4_);
          auVar61._0_4_ = ((iStack_7c - iVar11 ^ uVar8) - uVar8) * 8;
          auVar61._4_4_ = ((iStack_7c - iVar24 ^ uVar16) - uVar16) * 8;
          auVar61._8_4_ = ((iStack_7c - iVar25 ^ uVar35) - uVar35) * 8;
          auVar61._12_4_ = ((iStack_7c - iVar27 ^ uVar34) - uVar34) * 8;
          auVar13 = ~auVar22 & (auVar55 | _DAT_001e39e0) | auVar14 & auVar22;
          auVar18 = auVar13 ^ _DAT_001e3030;
          auVar14 = (auVar61 | _DAT_001e39f0) ^ _DAT_001e3030;
          auVar28._0_4_ = -(uint)(auVar18._0_4_ < auVar14._0_4_);
          auVar28._4_4_ = -(uint)(auVar18._4_4_ < auVar14._4_4_);
          auVar28._8_4_ = -(uint)(auVar18._8_4_ < auVar14._8_4_);
          auVar29 = (~auVar28 & SUB1612(auVar61 | _DAT_001e39f0,0) | auVar13._0_12_ & auVar28) &
                    DAT_001e39f0._0_12_;
          lVar26 = lVar66 * -3 + 0x2d;
          auVar23._8_4_ = (undefined4)lVar26;
          auVar23._12_4_ = (undefined4)((ulong)lVar26 >> 0x20);
          auVar23._0_8_ = lVar26;
          uVar67 = uVar67 | (ulong)auVar29._0_4_ << lVar6 * -3 + 0x2d;
          uVar7 = uVar7 | (ulong)auVar29._4_4_ << auVar23._8_8_;
          lVar5 = lVar5 + 2;
          lVar6 = lVar6 + 2;
          lVar66 = lVar66 + 2;
        } while (lVar5 != 0x10);
        uVar7 = uVar7 | uVar67;
        *(char *)((long)pDst + 2) = (char)(uVar7 >> 0x28);
        *(char *)((long)pDst + 3) = (char)(uVar7 >> 0x20);
        *(char *)((long)pDst + 4) = (char)(uVar7 >> 0x18);
        *(char *)((long)pDst + 5) = (char)(uVar7 >> 0x10);
        *(char *)((long)pDst + 6) = (char)(uVar7 >> 8);
        *(char *)((long)pDst + 7) = (char)uVar7;
        return;
      }
      __assert_fail("multiplier >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x38ba,
                    "void basist::transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block &, color32 (*)[4], void *)"
                   );
    }
    uVar4 = (ushort)uVar35 | 0x1d00;
  }
  *(ushort *)pDst = uVar4;
  *(undefined4 *)((long)pDst + 2) = 0x92244992;
  *(undefined2 *)((long)pDst + 6) = 0x2449;
  return;
}

Assistant:

void transcode_uastc_to_etc2_eac_a8(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		eac_block& dst = *static_cast<eac_block*>(pDst);
		const color32* pSrc_pixels = &block_pixels[0][0];

		if ((!g_uastc_mode_has_alpha[unpacked_src_blk.m_mode]) || (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR))
		{
			const uint32_t a = (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR) ? unpacked_src_blk.m_solid_color[3] : 255;

			dst.m_base = a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			return;
		}

		uint32_t min_a = 255, max_a = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			min_a = basisu::minimum<uint32_t>(min_a, pSrc_pixels[i].a);
			max_a = basisu::maximum<uint32_t>(max_a, pSrc_pixels[i].a);
		}

		if (min_a == max_a)
		{
			dst.m_base = min_a;
			dst.m_table = 13;
			dst.m_multiplier = 1;

			memcpy(dst.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));
			return;
		}

		const uint32_t table = unpacked_src_blk.m_etc2_hints & 0xF;
		const int multiplier = unpacked_src_blk.m_etc2_hints >> 4;

		assert(multiplier >= 1);

		dst.m_multiplier = multiplier;
		dst.m_table = table;

		const float range = (float)(g_eac_modifier_table[dst.m_table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]);
		const int center = (int)roundf(basisu::lerp((float)min_a, (float)max_a, (float)(0 - g_eac_modifier_table[dst.m_table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

		dst.m_base = center;

		const int8_t* pTable = &g_eac_modifier_table[dst.m_table][0];

		uint32_t vals[8];
		for (uint32_t j = 0; j < 8; j++)
			vals[j] = clamp255(center + (pTable[j] * multiplier));

		uint64_t sels = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t a = block_pixels[i & 3][i >> 2].a;

			const uint32_t err0 = (basisu::iabs(vals[0] - a) << 3) | 0;
			const uint32_t err1 = (basisu::iabs(vals[1] - a) << 3) | 1;
			const uint32_t err2 = (basisu::iabs(vals[2] - a) << 3) | 2;
			const uint32_t err3 = (basisu::iabs(vals[3] - a) << 3) | 3;
			const uint32_t err4 = (basisu::iabs(vals[4] - a) << 3) | 4;
			const uint32_t err5 = (basisu::iabs(vals[5] - a) << 3) | 5;
			const uint32_t err6 = (basisu::iabs(vals[6] - a) << 3) | 6;
			const uint32_t err7 = (basisu::iabs(vals[7] - a) << 3) | 7;

			const uint32_t min_err = basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(basisu::minimum(err0, err1, err2), err3), err4), err5), err6), err7);

			const uint64_t best_index = min_err & 7;
			sels |= (best_index << (45 - i * 3));
		}

		dst.set_selector_bits(sels);
	}